

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O2

void __thiscall
FLumpSourceMgr::FLumpSourceMgr(FLumpSourceMgr *this,FileReader *lump,j_decompress_ptr cinfo)

{
  this->Lump = lump;
  cinfo->src = &this->super_jpeg_source_mgr;
  (this->super_jpeg_source_mgr).init_source = InitSource;
  (this->super_jpeg_source_mgr).fill_input_buffer = FillInputBuffer;
  (this->super_jpeg_source_mgr).skip_input_data = SkipInputData;
  (this->super_jpeg_source_mgr).resync_to_restart = jpeg_resync_to_restart;
  (this->super_jpeg_source_mgr).term_source = TermSource;
  (this->super_jpeg_source_mgr).next_input_byte = (JOCTET *)0x0;
  (this->super_jpeg_source_mgr).bytes_in_buffer = 0;
  return;
}

Assistant:

FLumpSourceMgr::FLumpSourceMgr (FileReader *lump, j_decompress_ptr cinfo)
: Lump (lump)
{
	cinfo->src = this;
	init_source = InitSource;
	fill_input_buffer = FillInputBuffer;
	skip_input_data = SkipInputData;
	resync_to_restart = jpeg_resync_to_restart;
	term_source = TermSource;
	bytes_in_buffer = 0;
	next_input_byte = NULL;
}